

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::OpenPopupOnItemClick(char *str_id,ImGuiPopupFlags popup_flags)

{
  ImGuiWindow *pIVar1;
  bool bVar2;
  uint in_ESI;
  char *in_RDI;
  ImGuiWindow *unaff_retaddr;
  ImGuiID id;
  int mouse_button;
  ImGuiWindow *window;
  ImGuiPopupFlags in_stack_00000030;
  ImGuiID in_stack_00000034;
  ImGuiID local_24;
  ImGuiHoveredFlags in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  pIVar1 = GImGui->CurrentWindow;
  bVar2 = IsMouseReleased(in_ESI & 0x1f);
  if ((bVar2) && (bVar2 = IsItemHovered(in_stack_ffffffffffffffe0), bVar2)) {
    if (in_RDI == (char *)0x0) {
      local_24 = (pIVar1->DC).LastItemId;
    }
    else {
      local_24 = ImGuiWindow::GetID(unaff_retaddr,in_RDI,
                                    (char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    }
    if (local_24 == 0) {
      __assert_fail("id != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x2050,"void ImGui::OpenPopupOnItemClick(const char *, ImGuiPopupFlags)");
    }
    OpenPopupEx(in_stack_00000034,in_stack_00000030);
  }
  return;
}

Assistant:

void ImGui::OpenPopupOnItemClick(const char* str_id, ImGuiPopupFlags popup_flags)
{
    ImGuiWindow* window = GImGui->CurrentWindow;
    int mouse_button = (popup_flags & ImGuiPopupFlags_MouseButtonMask_);
    if (IsMouseReleased(mouse_button) && IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup))
    {
        ImGuiID id = str_id ? window->GetID(str_id) : window->DC.LastItemId; // If user hasn't passed an ID, we can use the LastItemID. Using LastItemID as a Popup ID won't conflict!
        IM_ASSERT(id != 0);                                                  // You cannot pass a NULL str_id if the last item has no identifier (e.g. a Text() item)
        OpenPopupEx(id, popup_flags);
    }
}